

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O2

hugeint_t duckdb::TryCastCInternal<unsigned_int,duckdb::hugeint_t,duckdb::TryCast>
                    (duckdb_result *result,idx_t col,idx_t row)

{
  bool bVar1;
  hugeint_t result_value;
  hugeint_t local_20;
  
  bVar1 = TryCast::Operation<unsigned_int,duckdb::hugeint_t>
                    (*(uint32_t *)((long)result->deprecated_columns[col].deprecated_data + row * 4),
                     &local_20,false);
  if (!bVar1) {
    local_20 = FetchDefaultValue::Operation<duckdb::hugeint_t>();
  }
  return local_20;
}

Assistant:

void *UnsafeFetchPtr(duckdb_result *result, idx_t col, idx_t row) {
	D_ASSERT(row < result->deprecated_row_count);
	return (void *)&(((T *)result->deprecated_columns[col].deprecated_data)[row]);
}